

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O1

void Saig_SynchTernarySimulate(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  ulong uVar5;
  void **ppvVar6;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  
  pVVar2 = pAig->vObjs;
  uVar9 = (ulong)(uint)nWords;
  if (0 < pVVar2->nSize) {
    ppvVar3 = pVVar2->pArray;
    lVar12 = 0;
    do {
      pvVar4 = ppvVar3[lVar12];
      if ((pvVar4 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar4 + 0x18) & 7) - 7)) {
        iVar11 = *(int *)((long)pvVar4 + 0x24);
        if (((long)iVar11 < 0) || (iVar1 = vSimInfo->nSize, iVar1 <= iVar11)) goto LAB_006698cc;
        uVar15 = *(ulong *)((long)pvVar4 + 8);
        if (uVar15 == 0) {
          uVar13 = 0xffffffff;
        }
        else {
          uVar13 = *(uint *)((uVar15 & 0xfffffffffffffffe) + 0x24);
        }
        if (((int)uVar13 < 0) || (iVar1 <= (int)uVar13)) goto LAB_006698cc;
        uVar5 = *(ulong *)((long)pvVar4 + 0x10);
        if (uVar5 == 0) {
          uVar10 = 0xffffffff;
        }
        else {
          uVar10 = *(uint *)((uVar5 & 0xfffffffffffffffe) + 0x24);
        }
        if (((int)uVar10 < 0) || (iVar1 <= (int)uVar10)) goto LAB_006698cc;
        ppvVar6 = vSimInfo->pArray;
        pvVar4 = ppvVar6[iVar11];
        pvVar7 = ppvVar6[uVar13];
        pvVar8 = ppvVar6[uVar10];
        if (((uint)uVar15 & (uint)uVar5 & 1) == 0) {
          if ((uVar5 & 1) == 0 || (uVar15 & 1) != 0) {
            if (((byte)uVar15 & (uVar5 & 1) == 0) == 0) {
              if (0 < nWords) {
                uVar15 = 0;
                do {
                  uVar13 = *(uint *)((long)pvVar7 + uVar15 * 4);
                  uVar10 = *(uint *)((long)pvVar8 + uVar15 * 4);
                  uVar14 = uVar10 & uVar13;
                  uVar13 = uVar13 >> 1;
                  uVar10 = uVar10 >> 1;
                  *(uint *)((long)pvVar4 + uVar15 * 4) =
                       ((~uVar13 & uVar14 & uVar10) + (uVar14 & uVar13 & ~uVar10)) * 2 & 0xaaaaaaaa
                       | uVar14;
                  uVar15 = uVar15 + 1;
                } while (uVar9 != uVar15);
              }
            }
            else if (0 < nWords) {
              uVar15 = 0;
              do {
                uVar13 = *(uint *)((long)pvVar7 + uVar15 * 4);
                uVar10 = uVar13 ^ 0x55555555 ^ uVar13 & 0x55555555 & uVar13 >> 1;
                uVar13 = *(uint *)((long)pvVar8 + uVar15 * 4);
                *(uint *)((long)pvVar4 + uVar15 * 4) =
                     ((~(uVar10 >> 1) & uVar10 & uVar13 & uVar13 >> 1) +
                     (~(uVar13 >> 1) & uVar13 & uVar10 & uVar10 >> 1)) * 2 & 0xaaaaaaaa |
                     uVar10 & uVar13;
                uVar15 = uVar15 + 1;
              } while (uVar9 != uVar15);
            }
          }
          else if (0 < nWords) {
            uVar15 = 0;
            do {
              uVar13 = *(uint *)((long)pvVar7 + uVar15 * 4);
              uVar10 = *(uint *)((long)pvVar8 + uVar15 * 4);
              uVar10 = uVar10 ^ 0x55555555 ^ uVar10 & 0x55555555 & uVar10 >> 1;
              *(uint *)((long)pvVar4 + uVar15 * 4) =
                   ((~(uVar13 >> 1) & uVar13 & uVar10 & uVar10 >> 1) +
                   (uVar10 & uVar13 & uVar13 >> 1 & ~(uVar10 >> 1))) * 2 & 0xaaaaaaaa |
                   uVar10 & uVar13;
              uVar15 = uVar15 + 1;
            } while (uVar9 != uVar15);
          }
        }
        else if (0 < nWords) {
          uVar15 = 0;
          do {
            uVar13 = *(uint *)((long)pvVar7 + uVar15 * 4);
            uVar10 = uVar13 ^ 0x55555555 ^ uVar13 & 0x55555555 & uVar13 >> 1;
            uVar13 = *(uint *)((long)pvVar8 + uVar15 * 4);
            uVar13 = uVar13 ^ 0x55555555 ^ uVar13 & 0x55555555 & uVar13 >> 1;
            uVar14 = uVar13 & uVar10;
            uVar10 = uVar10 >> 1;
            uVar13 = uVar13 >> 1;
            *(uint *)((long)pvVar4 + uVar15 * 4) =
                 ((~uVar10 & uVar14 & uVar13) + (uVar14 & uVar10 & ~uVar13)) * 2 & 0xaaaaaaaa |
                 uVar14;
            uVar15 = uVar15 + 1;
          } while (uVar9 != uVar15);
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar2->nSize);
  }
  if (0 < pAig->nRegs) {
    pVVar2 = pAig->vCos;
    iVar11 = 0;
    do {
      uVar13 = pAig->nTruePos + iVar11;
      if (((int)uVar13 < 0) || (pVVar2->nSize <= (int)uVar13)) {
LAB_006698cc:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar4 = pVVar2->pArray[uVar13];
      iVar1 = *(int *)((long)pvVar4 + 0x24);
      if (((long)iVar1 < 0) || (vSimInfo->nSize <= iVar1)) goto LAB_006698cc;
      uVar15 = *(ulong *)((long)pvVar4 + 8);
      if (uVar15 == 0) {
        uVar13 = 0xffffffff;
      }
      else {
        uVar13 = *(uint *)((uVar15 & 0xfffffffffffffffe) + 0x24);
      }
      if (((int)uVar13 < 0) || (vSimInfo->nSize <= (int)uVar13)) goto LAB_006698cc;
      pvVar4 = vSimInfo->pArray[iVar1];
      pvVar7 = vSimInfo->pArray[uVar13];
      if ((uVar15 & 1) == 0) {
        if (0 < nWords) {
          uVar15 = 0;
          do {
            *(undefined4 *)((long)pvVar4 + uVar15 * 4) = *(undefined4 *)((long)pvVar7 + uVar15 * 4);
            uVar15 = uVar15 + 1;
          } while (uVar9 != uVar15);
        }
      }
      else if (0 < nWords) {
        uVar15 = 0;
        do {
          uVar13 = *(uint *)((long)pvVar7 + uVar15 * 4);
          *(uint *)((long)pvVar4 + uVar15 * 4) =
               uVar13 ^ 0x55555555 ^ uVar13 & 0x55555555 & uVar13 >> 1;
          uVar15 = uVar15 + 1;
        } while (uVar9 != uVar15);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < pAig->nRegs);
  }
  return;
}

Assistant:

void Saig_SynchTernarySimulate( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords )
{
    Aig_Obj_t * pObj;
    unsigned * pSim0, * pSim1, * pSim;
    int i, w;
    // simulate nodes
    Aig_ManForEachNode( pAig, pObj, i )
    {
        pSim  = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        pSim0 = (unsigned *)Vec_PtrEntry( vSimInfo, Aig_ObjFaninId0(pObj) );
        pSim1 = (unsigned *)Vec_PtrEntry( vSimInfo, Aig_ObjFaninId1(pObj) );
        if ( Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchAnd( Saig_SynchNot(pSim0[w]), Saig_SynchNot(pSim1[w]) );
        }
        else if ( !Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchAnd( pSim0[w], Saig_SynchNot(pSim1[w]) );
        }
        else if ( Aig_ObjFaninC0(pObj) && !Aig_ObjFaninC1(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchAnd( Saig_SynchNot(pSim0[w]), pSim1[w] );
        }
        else // if ( !Aig_ObjFaninC0(pObj) && !Aig_ObjFaninC1(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchAnd( pSim0[w], pSim1[w] );
        }
    }
    // transfer values to register inputs
    Saig_ManForEachLi( pAig, pObj, i )
    {
        pSim  = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        pSim0 = (unsigned *)Vec_PtrEntry( vSimInfo, Aig_ObjFaninId0(pObj) );
        if ( Aig_ObjFaninC0(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchNot( pSim0[w] );
        }
        else
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = pSim0[w];
        }
    }
}